

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::PushRegexp(ParseState *this,Regexp *re)

{
  bool bVar1;
  int iVar2;
  ParseFlags parse_flags;
  RegexpOp op;
  pointer pRVar3;
  Regexp *pRVar4;
  iterator size;
  _Rb_tree_const_iterator<re2::RuneRange> in_stack_ffffffffffffffc0;
  Rune r_1;
  _Rb_tree_const_iterator<re2::RuneRange> local_28;
  Rune local_1c;
  Regexp *pRStack_18;
  Rune r;
  Regexp *re_local;
  ParseState *this_local;
  
  pRStack_18 = re;
  re_local = (Regexp *)this;
  MaybeConcatString(this,-1,NoParseFlags);
  if ((pRStack_18->op_ == '\x14') && ((pRStack_18->field_7).field_1.name_ != (string *)0x0)) {
    CharClassBuilder::RemoveAbove((pRStack_18->field_7).field_3.ccb_,this->rune_max_);
    iVar2 = CharClassBuilder::size((pRStack_18->field_7).field_3.ccb_);
    if (iVar2 == 1) {
      local_28._M_node = (_Base_ptr)CharClassBuilder::begin((pRStack_18->field_7).field_3.ccb_);
      pRVar3 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_28);
      local_1c = pRVar3->lo;
      Decref(pRStack_18);
      pRVar4 = (Regexp *)operator_new((size_t)in_stack_ffffffffffffffc0._M_node);
      Regexp(pRVar4,kRegexpLiteral,this->flags_);
      (pRVar4->field_7).field_0.max_ = local_1c;
      pRStack_18 = pRVar4;
    }
    else {
      iVar2 = CharClassBuilder::size((pRStack_18->field_7).field_3.ccb_);
      if (iVar2 == 2) {
        size = CharClassBuilder::begin((pRStack_18->field_7).field_3.ccb_);
        pRVar3 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                           ((_Rb_tree_const_iterator<re2::RuneRange> *)&stack0xffffffffffffffc0);
        iVar2 = pRVar3->lo;
        if (((0x40 < iVar2) && (iVar2 < 0x5b)) &&
           (bVar1 = CharClassBuilder::Contains((pRStack_18->field_7).field_3.ccb_,iVar2 + 0x20),
           bVar1)) {
          Decref(pRStack_18);
          pRVar4 = (Regexp *)operator_new((size_t)size._M_node);
          parse_flags = operator|(this->flags_,FoldCase);
          Regexp(pRVar4,kRegexpLiteral,parse_flags);
          (pRVar4->field_7).field_0.max_ = iVar2 + 0x20;
          pRStack_18 = pRVar4;
        }
      }
    }
  }
  op = Regexp::op(pRStack_18);
  bVar1 = IsMarker(this,op);
  if (!bVar1) {
    bVar1 = ComputeSimple(pRStack_18);
    pRStack_18->simple_ = bVar1;
  }
  pRStack_18->down_ = this->stacktop_;
  this->stacktop_ = pRStack_18;
  return true;
}

Assistant:

bool Regexp::ParseState::PushRegexp(Regexp* re) {
  MaybeConcatString(-1, NoParseFlags);

  // Special case: a character class of one character is just
  // a literal.  This is a common idiom for escaping
  // single characters (e.g., [.] instead of \.), and some
  // analysis does better with fewer character classes.
  // Similarly, [Aa] can be rewritten as a literal A with ASCII case folding.
  if (re->op_ == kRegexpCharClass && re->ccb_ != NULL) {
    re->ccb_->RemoveAbove(rune_max_);
    if (re->ccb_->size() == 1) {
      Rune r = re->ccb_->begin()->lo;
      re->Decref();
      re = new Regexp(kRegexpLiteral, flags_);
      re->rune_ = r;
    } else if (re->ccb_->size() == 2) {
      Rune r = re->ccb_->begin()->lo;
      if ('A' <= r && r <= 'Z' && re->ccb_->Contains(r + 'a' - 'A')) {
        re->Decref();
        re = new Regexp(kRegexpLiteral, flags_ | FoldCase);
        re->rune_ = r + 'a' - 'A';
      }
    }
  }

  if (!IsMarker(re->op()))
    re->simple_ = re->ComputeSimple();
  re->down_ = stacktop_;
  stacktop_ = re;
  return true;
}